

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_read_image.cxx
# Opt level: O3

uchar * read_win_rectangle(uchar *p,int X,int Y,int w,int h,int alpha)

{
  byte bVar1;
  Visual *pVVar2;
  int iVar3;
  ulong uVar4;
  uint3 uVar5;
  unsigned_long uVar6;
  ushort uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Fl_Window *pFVar11;
  void *__ptr;
  int *piVar12;
  undefined8 uVar13;
  long lVar14;
  uchar *puVar15;
  int iVar16;
  uint uVar17;
  XColor *pXVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  byte *pbVar24;
  int iVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  uint uVar29;
  undefined2 *puVar30;
  uint *puVar31;
  uchar uVar32;
  int iVar33;
  uint uVar34;
  ulong uVar35;
  uchar uVar36;
  uchar *puVar37;
  bool bVar38;
  int iVar40;
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  int iVar42;
  long lStack_13078;
  ulong uStack_13070;
  int sh;
  int sw;
  int dy;
  XVisualInfo *pXStack_13048;
  int sy;
  int sx;
  uchar cvals [4096] [3];
  XColor colors [4096];
  
  iVar8 = -w;
  iVar33 = w;
  if (w < 1) {
    iVar33 = iVar8;
  }
  if ((w < 0) || (pFVar11 = fl_find(fl_window), pFVar11 != (Fl_Window *)0x0)) {
    XTranslateCoordinates
              (fl_display,fl_window,
               *(undefined8 *)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),X,Y,
               cvals,&dy,colors);
    Fl::screen_xywh(&sx,&sy,&sw,&sh,fl_screen);
    if ((sx <= (int)cvals._0_4_) &&
       (((sy <= dy && (cvals._0_4_ + iVar33 <= sw + sx)) && (dy + h <= sh + sy))))
    goto LAB_001f1e79;
    iVar40 = sx;
    if (cvals._0_4_ - sx != 0 && sx <= (int)cvals._0_4_) {
      iVar40 = cvals._0_4_;
    }
    iVar42 = -(cvals._0_4_ - sx);
    if (sx <= (int)cvals._0_4_) {
      iVar42 = 0;
    }
    iVar25 = (sw + sx) - iVar40;
    if ((iVar33 - iVar42) + iVar40 <= sw + sx) {
      iVar25 = iVar33 - iVar42;
    }
    iVar40 = sy;
    if (dy - sy != 0 && sy <= dy) {
      iVar40 = dy;
    }
    iVar21 = -(dy - sy);
    if (sy <= dy) {
      iVar21 = 0;
    }
    iVar3 = (sy + sh) - iVar40;
    if ((h - iVar21) + iVar40 <= sy + sh) {
      iVar3 = h - iVar21;
    }
    if (iVar25 < 1) {
      return (uchar *)0x0;
    }
    if (iVar3 < 1) {
      return (uchar *)0x0;
    }
    pXStack_13048 = fl_visual;
    iVar40 = fl_visual->depth;
    iVar9 = iVar40 + 7;
    if (-1 < iVar40) {
      iVar9 = iVar40;
    }
    iVar16 = (iVar9 >> 3) - ((iVar9 >> 3) - (iVar9 >> 0x1f) & 0x1ffffffeU);
    iVar9 = iVar40 + iVar16 * 8;
    iVar16 = iVar40 + iVar16 * 8 + 7;
    if (-1 < iVar9) {
      iVar16 = iVar9;
    }
    __ptr = malloc((long)(iVar33 * h * (iVar16 >> 3)));
    piVar12 = (int *)XCreateImage(fl_display,pXStack_13048->visual,iVar40,2,0,__ptr,iVar33,h,iVar9,0
                                 );
    if (piVar12 == (int *)0x0) {
      if (__ptr == (void *)0x0) {
        return (uchar *)0x0;
      }
      free(__ptr);
      return (uchar *)0x0;
    }
    uVar13 = XSetErrorHandler(xgetimageerrhandler);
    lVar14 = XGetSubImage(fl_display,fl_window,X + iVar42,Y + iVar21,iVar25,iVar3,0xffffffffffffffff
                          ,2,piVar12,iVar42,iVar21);
    XSetErrorHandler(uVar13);
    if (lVar14 == 0) {
      (**(code **)(piVar12 + 0x18))(piVar12);
      return (uchar *)0x0;
    }
  }
  else {
LAB_001f1e79:
    uVar13 = XSetErrorHandler(xgetimageerrhandler);
    piVar12 = (int *)XGetImage(fl_display,fl_window,X,Y,iVar33,h,0xffffffffffffffff,2);
    XSetErrorHandler(uVar13);
    if (piVar12 == (int *)0x0) {
      return (uchar *)0x0;
    }
  }
  uVar10 = 4 - (alpha == 0);
  uVar23 = (ulong)(int)(iVar33 * h * uVar10);
  if (p == (uchar *)0x0) {
    p = (uchar *)operator_new__(uVar23);
  }
  memset(p,alpha,uVar23);
  uVar23 = *(ulong *)(piVar12 + 0xe);
  if (uVar23 == 0) {
    if (0xc < piVar12[0xc]) {
      pVVar2 = fl_visual->visual;
      uVar23 = pVVar2->red_mask;
      uVar6 = pVVar2->green_mask;
      *(unsigned_long *)(piVar12 + 0xe) = pVVar2->red_mask;
      *(unsigned_long *)(piVar12 + 0x10) = uVar6;
      *(unsigned_long *)(piVar12 + 0x12) = pVVar2->blue_mask;
      if (uVar23 != 0) goto LAB_001f1f2a;
    }
    iVar33 = fl_visual->visual->map_entries;
    lVar14 = (long)iVar33;
    if (lVar14 < 1) {
      XQueryColors(fl_display,fl_colormap,colors,iVar33);
    }
    else {
      lVar19 = lVar14 + -1;
      auVar39._8_4_ = (int)lVar19;
      auVar39._0_8_ = lVar19;
      auVar39._12_4_ = (int)((ulong)lVar19 >> 0x20);
      pXVar18 = colors + 1;
      uVar23 = 0;
      auVar41 = _DAT_00210020;
      do {
        bVar38 = SUB164(auVar39 ^ _DAT_00210030,0) < SUB164(auVar41 ^ _DAT_00210030,0);
        iVar40 = SUB164(auVar39 ^ _DAT_00210030,4);
        iVar42 = SUB164(auVar41 ^ _DAT_00210030,4);
        if ((bool)(~(iVar40 < iVar42 || iVar42 == iVar40 && bVar38) & 1)) {
          pXVar18[-1].pixel = uVar23;
        }
        if (iVar40 >= iVar42 && (iVar42 != iVar40 || !bVar38)) {
          pXVar18->pixel = uVar23 + 1;
        }
        uVar23 = uVar23 + 2;
        lVar19 = auVar41._8_8_;
        auVar41._0_8_ = auVar41._0_8_ + 2;
        auVar41._8_8_ = lVar19 + 2;
        pXVar18 = pXVar18 + 2;
      } while ((iVar33 + 1U & 0xfffffffe) != uVar23);
      XQueryColors(fl_display,fl_colormap,colors);
      if (0 < iVar33) {
        puVar15 = cvals[0] + 2;
        lVar19 = 0;
        do {
          (*(uchar (*) [3])(puVar15 + -2))[0] = *(uchar *)((long)&colors[0].red + lVar19 + 1);
          puVar15[-1] = *(uchar *)((long)&colors[0].green + lVar19 + 1);
          *puVar15 = *(uchar *)((long)&colors[0].blue + lVar19 + 1);
          puVar15 = puVar15 + 3;
          lVar19 = lVar19 + 0x10;
        } while (lVar14 * 0x10 != lVar19);
      }
    }
    if (0 < piVar12[1]) {
      if (iVar8 < w) {
        iVar8 = w;
      }
      uVar23 = 0;
      lVar14 = 0;
      do {
        if (piVar12[0xc] - 1U < 0xc) {
          pbVar24 = (byte *)((long)(int)lVar14 * (long)piVar12[0xb] + *(long *)(piVar12 + 4));
          switch(piVar12[0xc]) {
          case 1:
            if (0 < *piVar12) {
              puVar37 = p + uVar23 + 2;
              iVar33 = *piVar12 + 1;
              uVar35 = 0x80;
              do {
                uVar17 = (uint)uVar35;
                if ((uVar17 & *pbVar24) == 0) {
                  puVar37[-1] = cvals[0][1];
                  uVar32 = cvals[0][0];
                  uVar36 = cvals[0][2];
                }
                else {
                  puVar37[-1] = cvals[1][1];
                  uVar32 = cvals[1][0];
                  uVar36 = cvals[1][2];
                }
                uVar35 = uVar35 >> 1;
                pbVar24 = pbVar24 + (uVar17 < 2);
                puVar37[-2] = uVar32;
                *puVar37 = uVar36;
                if (uVar17 < 2) {
                  uVar35 = 0x80;
                }
                iVar33 = iVar33 + -1;
                puVar37 = puVar37 + uVar10;
              } while (1 < iVar33);
            }
            break;
          case 2:
            if (0 < *piVar12) {
              puVar37 = p + uVar23 + 2;
              uVar17 = *piVar12 + 1;
              iVar33 = 6;
              do {
                uVar34 = *pbVar24 >> ((byte)iVar33 & 0x1f) & 3;
                puVar37[-2] = cvals[uVar34][0];
                puVar37[-1] = cvals[uVar34][1];
                *puVar37 = cvals[uVar34][2];
                bVar38 = iVar33 == 0;
                iVar33 = iVar33 + -2;
                if (bVar38) {
                  iVar33 = 6;
                }
                pbVar24 = pbVar24 + bVar38;
                uVar17 = uVar17 - 1;
                puVar37 = puVar37 + uVar10;
              } while (1 < uVar17);
            }
            break;
          case 4:
            if (0 < *piVar12) {
              puVar37 = p + uVar23 + 2;
              iVar33 = *piVar12 + 1;
              bVar38 = true;
              do {
                bVar38 = !bVar38;
                bVar26 = *pbVar24 >> 4;
                if (bVar38) {
                  bVar26 = *pbVar24 & 0xf;
                }
                puVar37[-2] = cvals[bVar26][0];
                puVar37[-1] = cvals[bVar26][1];
                *puVar37 = cvals[bVar26][2];
                pbVar24 = pbVar24 + bVar38;
                iVar33 = iVar33 + -1;
                puVar37 = puVar37 + uVar10;
              } while (1 < iVar33);
            }
            break;
          case 8:
            if (0 < *piVar12) {
              puVar37 = p + uVar23 + 2;
              uVar17 = *piVar12 + 1;
              do {
                puVar37[-2] = cvals[*pbVar24][0];
                puVar37[-1] = cvals[*pbVar24][1];
                *puVar37 = cvals[*pbVar24][2];
                pbVar24 = pbVar24 + 1;
                uVar17 = uVar17 - 1;
                puVar37 = puVar37 + uVar10;
              } while (1 < uVar17);
            }
            break;
          case 0xc:
            if (0 < *piVar12) {
              puVar37 = p + uVar23 + 2;
              iVar33 = *piVar12 + 1;
              bVar38 = false;
              do {
                if (bVar38) {
                  uVar35 = (ulong)((pbVar24[1] & 0xf) << 8) | (ulong)pbVar24[2];
                  lVar19 = 3;
                }
                else {
                  uVar35 = (ulong)((uint)(pbVar24[1] >> 4) | (uint)*pbVar24 << 4);
                  lVar19 = 0;
                }
                bVar38 = !bVar38;
                puVar37[-2] = cvals[uVar35][0];
                puVar37[-1] = cvals[uVar35][1];
                *puVar37 = cvals[uVar35][2];
                pbVar24 = pbVar24 + lVar19;
                iVar33 = iVar33 + -1;
                puVar37 = puVar37 + uVar10;
              } while (1 < iVar33);
            }
          }
        }
        lVar14 = lVar14 + 1;
        uVar23 = (ulong)((int)uVar23 + iVar8 * uVar10);
      } while (lVar14 < piVar12[1]);
    }
  }
  else {
LAB_001f1f2a:
    bVar26 = 0;
    if ((uVar23 & 1) == 0) {
      bVar27 = 0;
      uVar35 = uVar23 & 0xffffffff;
      do {
        uVar35 = uVar35 >> 1;
        bVar27 = bVar27 + 1;
        uVar4 = uVar23 & 2;
        uVar17 = (uint)uVar35;
        uVar23 = uVar35;
      } while (uVar4 == 0);
    }
    else {
      uVar17 = (uint)uVar23;
      bVar27 = 0;
    }
    uVar23 = *(ulong *)(piVar12 + 0x10);
    if ((uVar23 & 1) == 0) {
      bVar26 = 0;
      uVar35 = uVar23 & 0xffffffff;
      do {
        uVar35 = uVar35 >> 1;
        bVar26 = bVar26 + 1;
        uVar4 = uVar23 & 2;
        uVar34 = (uint)uVar35;
        uVar23 = uVar35;
      } while (uVar4 == 0);
    }
    else {
      uVar34 = (uint)uVar23;
    }
    uVar23 = *(ulong *)(piVar12 + 0x12);
    bVar28 = 0;
    if ((uVar23 & 1) == 0) {
      bVar28 = 0;
      uVar35 = uVar23 & 0xffffffff;
      do {
        uVar35 = uVar35 >> 1;
        bVar28 = bVar28 + 1;
        uVar4 = uVar23 & 2;
        uVar29 = (uint)uVar35;
        uVar23 = uVar35;
      } while (uVar4 == 0);
    }
    else {
      uVar29 = (uint)uVar23;
    }
    if (0 < piVar12[1]) {
      if (iVar8 < w) {
        iVar8 = w;
      }
      uStack_13070 = 0;
      lStack_13078 = 0;
      do {
        uVar20 = piVar12[0xc] << 0x1e | piVar12[0xc] - 8U >> 2;
        if (uVar20 < 7) {
          lVar14 = *(long *)(piVar12 + 4);
          lVar19 = (long)(piVar12[0xb] * (int)lStack_13078);
          puVar31 = (uint *)(lVar14 + lVar19);
          switch(uVar20) {
          case 0:
            if (0 < *piVar12) {
              puVar37 = p + uStack_13070 + 2;
              uVar20 = *piVar12 + 1;
              do {
                bVar1 = (byte)*puVar31;
                puVar37[-2] = (uchar)(((bVar1 >> (bVar27 & 0x1f) & uVar17) * 0xff) / uVar17);
                puVar37[-1] = (uchar)(((bVar1 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34);
                *puVar37 = (uchar)(((bVar1 >> (bVar28 & 0x1f) & uVar29) * 0xff) / uVar29);
                puVar31 = (uint *)((long)puVar31 + 1);
                uVar20 = uVar20 - 1;
                puVar37 = puVar37 + uVar10;
              } while (1 < uVar20);
            }
            break;
          case 1:
            if (0 < *piVar12) {
              puVar37 = p + uStack_13070 + 2;
              iVar33 = *piVar12 + 1;
              bVar38 = false;
              do {
                if (bVar38) {
                  uVar20 = (*(byte *)((long)puVar31 + 1) & 0xf) << 8 |
                           (uint)*(byte *)((long)puVar31 + 2);
                  lVar14 = 3;
                }
                else {
                  uVar20 = (uint)(*(byte *)((long)puVar31 + 1) >> 4) | (uint)(byte)*puVar31 << 4;
                  lVar14 = 0;
                }
                bVar38 = !bVar38;
                puVar37[-2] = (uchar)(((uVar20 >> (bVar27 & 0x1f) & uVar17) * 0xff) / uVar17);
                puVar37[-1] = (uchar)(((uVar20 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34);
                *puVar37 = (uchar)(((uVar20 >> (bVar28 & 0x1f) & uVar29) * 0xff) / uVar29);
                puVar31 = (uint *)((long)puVar31 + lVar14);
                iVar33 = iVar33 + -1;
                puVar37 = puVar37 + uVar10;
              } while (1 < iVar33);
            }
            break;
          case 2:
            iVar33 = *piVar12;
            if (piVar12[6] == 0) {
              if (0 < iVar33) {
                puVar37 = p + uStack_13070 + 2;
                uVar20 = iVar33 + 1;
                lVar14 = lVar14 + lVar19 + 1;
                do {
                  uVar7 = *(ushort *)(lVar14 + -1);
                  puVar37[-2] = (uchar)(((uVar7 >> (bVar27 & 0x1f) & uVar17) * 0xff) / uVar17);
                  puVar37[-1] = (uchar)(((uVar7 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34);
                  *puVar37 = (uchar)(((uVar7 >> (bVar28 & 0x1f) & uVar29) * 0xff) / uVar29);
                  uVar20 = uVar20 - 1;
                  lVar14 = lVar14 + 2;
                  puVar37 = puVar37 + uVar10;
                } while (1 < uVar20);
              }
            }
            else if (0 < iVar33) {
              puVar37 = p + uStack_13070 + 2;
              uVar20 = iVar33 + 1;
              do {
                uVar7 = (ushort)*puVar31 << 8 | (ushort)*puVar31 >> 8;
                puVar37[-2] = (uchar)(((uVar7 >> (bVar27 & 0x1f) & uVar17) * 0xff) / uVar17);
                puVar37[-1] = (uchar)(((uVar7 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34);
                *puVar37 = (uchar)(((uVar7 >> (bVar28 & 0x1f) & uVar29) * 0xff) / uVar29);
                puVar31 = (uint *)((long)puVar31 + 2);
                uVar20 = uVar20 - 1;
                puVar37 = puVar37 + uVar10;
              } while (1 < uVar20);
            }
            break;
          case 4:
            iVar33 = *piVar12;
            if (piVar12[6] == 0) {
              if (0 < iVar33) {
                puVar37 = p + uStack_13070 + 2;
                uVar20 = iVar33 + 1;
                puVar30 = (undefined2 *)(lVar14 + lVar19 + 1);
                do {
                  uVar5 = CONCAT21(*puVar30,*(undefined1 *)((long)puVar30 + -1));
                  puVar37[-2] = (uchar)(((uVar5 >> (bVar27 & 0x1f) & uVar17) * 0xff) / uVar17);
                  puVar37[-1] = (uchar)(((uVar5 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34);
                  *puVar37 = (uchar)(((uVar5 >> (bVar28 & 0x1f) & uVar29) * 0xff) / uVar29);
                  uVar20 = uVar20 - 1;
                  puVar30 = (undefined2 *)((long)puVar30 + 3);
                  puVar37 = puVar37 + uVar10;
                } while (1 < uVar20);
              }
            }
            else if (0 < iVar33) {
              puVar37 = p + uStack_13070 + 2;
              uVar20 = iVar33 + 1;
              do {
                uVar22 = (uint)*(byte *)((long)puVar31 + 2) |
                         (uint)*(byte *)((long)puVar31 + 1) << 8 | (uint)(byte)*puVar31 << 0x10;
                puVar37[-2] = (uchar)(((uVar22 >> (bVar27 & 0x1f) & uVar17) * 0xff) / uVar17);
                puVar37[-1] = (uchar)(((uVar22 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34);
                *puVar37 = (uchar)(((uVar22 >> (bVar28 & 0x1f) & uVar29) * 0xff) / uVar29);
                puVar31 = (uint *)((long)puVar31 + 3);
                uVar20 = uVar20 - 1;
                puVar37 = puVar37 + uVar10;
              } while (1 < uVar20);
            }
            break;
          case 6:
            iVar33 = *piVar12;
            if (piVar12[6] == 0) {
              if (0 < iVar33) {
                puVar37 = p + uStack_13070 + 2;
                uVar20 = iVar33 + 1;
                lVar14 = lVar14 + lVar19 + 2;
                do {
                  iVar33 = *(int *)(lVar14 + -2);
                  puVar37[-2] = (uchar)(((iVar33 >> (bVar27 & 0x1f) & uVar17) * 0xff) / uVar17);
                  puVar37[-1] = (uchar)(((iVar33 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34);
                  *puVar37 = (uchar)(((iVar33 >> (bVar28 & 0x1f) & uVar29) * 0xff) / uVar29);
                  uVar20 = uVar20 - 1;
                  lVar14 = lVar14 + 4;
                  puVar37 = puVar37 + uVar10;
                } while (1 < uVar20);
              }
            }
            else if (0 < iVar33) {
              puVar37 = p + uStack_13070 + 2;
              uVar20 = iVar33 + 1;
              do {
                uVar22 = *puVar31;
                uVar22 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                         uVar22 << 0x18;
                puVar37[-2] = (uchar)((((int)uVar22 >> (bVar27 & 0x1f) & uVar17) * 0xff) / uVar17);
                puVar37[-1] = (uchar)((((int)uVar22 >> (bVar26 & 0x1f) & uVar34) * 0xff) / uVar34);
                *puVar37 = (uchar)((((int)uVar22 >> (bVar28 & 0x1f) & uVar29) * 0xff) / uVar29);
                puVar31 = puVar31 + 1;
                uVar20 = uVar20 - 1;
                puVar37 = puVar37 + uVar10;
              } while (1 < uVar20);
            }
          }
        }
        lStack_13078 = lStack_13078 + 1;
        uStack_13070 = (ulong)((int)uStack_13070 + iVar8 * uVar10);
      } while (lStack_13078 < piVar12[1]);
    }
  }
  (**(code **)(piVar12 + 0x18))(piVar12);
  return p;
}

Assistant:

static uchar *read_win_rectangle(uchar *p, int X, int Y, int w, int h, int alpha)
{
  XImage	*image;		// Captured image
  int		i, maxindex;	// Looping vars
  int           x, y;		// Current X & Y in image
  int		d;		// Depth of image
  unsigned char *line,		// Array to hold image row
		*line_ptr;	// Pointer to current line image
  unsigned char	*pixel;		// Current color value
  XColor	colors[4096];	// Colors from the colormap...
  unsigned char	cvals[4096][3];	// Color values from the colormap...
  unsigned	index_mask,
		index_shift,
		red_mask,
		red_shift,
		green_mask,
		green_shift,
		blue_mask,
		blue_shift;


  //
  // Under X11 we have the option of the XGetImage() interface or SGI's
  // ReadDisplay extension which does all of the really hard work for
  // us...
  //
  int allow_outside = w < 0;    // negative w allows negative X or Y, that is, window frame
  if (w < 0) w = - w;

#  ifdef __sgi
  if (XReadDisplayQueryExtension(fl_display, &i, &i)) {
    image = XReadDisplay(fl_display, fl_window, X, Y, w, h, 0, NULL);
  } else
#  else
  image = 0;
#  endif // __sgi

  if (!image) {
    // fetch absolute coordinates
    int dx, dy, sx, sy, sw, sh;
    Window child_win;
    
    Fl_Window *win;
    if (allow_outside) win = (Fl_Window*)1;
    else win = fl_find(fl_window);
    if (win) {
      XTranslateCoordinates(fl_display, fl_window,
          RootWindow(fl_display, fl_screen), X, Y, &dx, &dy, &child_win);
      // screen dimensions
      Fl::screen_xywh(sx, sy, sw, sh, fl_screen);
    }
    if (!win || (dx >= sx && dy >= sy && dx + w <= sx+sw && dy + h <= sy+sh)) {
      // the image is fully contained, we can use the traditional method
      // however, if the window is obscured etc. the function will still fail. Make sure we
      // catch the error and continue, otherwise an exception will be thrown.
      XErrorHandler old_handler = XSetErrorHandler(xgetimageerrhandler);
      image = XGetImage(fl_display, fl_window, X, Y, w, h, AllPlanes, ZPixmap);
      XSetErrorHandler(old_handler);
    } else {
      // image is crossing borders, determine visible region
      int nw, nh, noffx, noffy;
      noffx = fl_subimage_offsets(sx, sw, dx, w, nw);
      noffy = fl_subimage_offsets(sy, sh, dy, h, nh);
      if (nw <= 0 || nh <= 0) return 0;

      // allocate the image
      int bpp = fl_visual->depth + ((fl_visual->depth / 8) % 2) * 8;
      char* buf = (char*)malloc(bpp / 8 * w * h);
      image = XCreateImage(fl_display, fl_visual->visual,
	  fl_visual->depth, ZPixmap, 0, buf, w, h, bpp, 0);
      if (!image) {
	if (buf) free(buf);
	return 0;
      }

      XErrorHandler old_handler = XSetErrorHandler(xgetimageerrhandler);
      XImage *subimg = XGetSubImage(fl_display, fl_window, X + noffx, Y + noffy,
                                    nw, nh, AllPlanes, ZPixmap, image, noffx, noffy);
      XSetErrorHandler(old_handler);
      if (!subimg) {
        XDestroyImage(image);
        return 0;
      }
    }
  }

  if (!image) return 0;

#ifdef DEBUG
  printf("width            = %d\n", image->width);
  printf("height           = %d\n", image->height);
  printf("xoffset          = %d\n", image->xoffset);
  printf("format           = %d\n", image->format);
  printf("data             = %p\n", image->data);
  printf("byte_order       = %d\n", image->byte_order);
  printf("bitmap_unit      = %d\n", image->bitmap_unit);
  printf("bitmap_bit_order = %d\n", image->bitmap_bit_order);
  printf("bitmap_pad       = %d\n", image->bitmap_pad);
  printf("depth            = %d\n", image->depth);
  printf("bytes_per_line   = %d\n", image->bytes_per_line);
  printf("bits_per_pixel   = %d\n", image->bits_per_pixel);
  printf("red_mask         = %08x\n", image->red_mask);
  printf("green_mask       = %08x\n", image->green_mask);
  printf("blue_mask        = %08x\n", image->blue_mask);
  printf("map_entries      = %d\n", fl_visual->visual->map_entries);
#endif // DEBUG

  d = alpha ? 4 : 3;

  // Allocate the image data array as needed...
  if (!p) p = new uchar[w * h * d];

  // Initialize the default colors/alpha in the whole image...
  memset(p, alpha, w * h * d);

  // Check that we have valid mask/shift values...
  if (!image->red_mask && image->bits_per_pixel > 12) {
    // Greater than 12 bits must be TrueColor...
    image->red_mask   = fl_visual->visual->red_mask;
    image->green_mask = fl_visual->visual->green_mask;
    image->blue_mask  = fl_visual->visual->blue_mask;

#ifdef DEBUG
    puts("\n---- UPDATED ----");
    printf("fl_redmask       = %08x\n", fl_redmask);
    printf("fl_redshift      = %d\n", fl_redshift);
    printf("fl_greenmask     = %08x\n", fl_greenmask);
    printf("fl_greenshift    = %d\n", fl_greenshift);
    printf("fl_bluemask      = %08x\n", fl_bluemask);
    printf("fl_blueshift     = %d\n", fl_blueshift);
    printf("red_mask         = %08x\n", image->red_mask);
    printf("green_mask       = %08x\n", image->green_mask);
    printf("blue_mask        = %08x\n", image->blue_mask);
#endif // DEBUG
  }

  // Check if we have colormap image...
  if (!image->red_mask) {
    // Get the colormap entries for this window...
    maxindex = fl_visual->visual->map_entries;

    for (i = 0; i < maxindex; i ++) colors[i].pixel = i;

    XQueryColors(fl_display, fl_colormap, colors, maxindex);

    for (i = 0; i < maxindex; i ++) {
      cvals[i][0] = colors[i].red >> 8;
      cvals[i][1] = colors[i].green >> 8;
      cvals[i][2] = colors[i].blue >> 8;
    }

    // Read the pixels and output an RGB image...
    for (y = 0; y < image->height; y ++) {
      pixel = (unsigned char *)(image->data + y * image->bytes_per_line);
      line  = p + y * w * d;

      switch (image->bits_per_pixel) {
        case 1 :
	  for (x = image->width, line_ptr = line, index_mask = 128;
	       x > 0;
	       x --, line_ptr += d) {
	    if (*pixel & index_mask) {
	      line_ptr[0] = cvals[1][0];
	      line_ptr[1] = cvals[1][1];
	      line_ptr[2] = cvals[1][2];
            } else {
	      line_ptr[0] = cvals[0][0];
	      line_ptr[1] = cvals[0][1];
	      line_ptr[2] = cvals[0][2];
            }

            if (index_mask > 1) {
	      index_mask >>= 1;
	    } else {
              index_mask = 128;
              pixel ++;
            }
	  }
          break;

        case 2 :
	  for (x = image->width, line_ptr = line, index_shift = 6;
	       x > 0;
	       x --, line_ptr += d) {
	    i = (*pixel >> index_shift) & 3;

	    line_ptr[0] = cvals[i][0];
	    line_ptr[1] = cvals[i][1];
	    line_ptr[2] = cvals[i][2];

            if (index_shift > 0) {
              index_mask >>= 2;
              index_shift -= 2;
            } else {
              index_mask  = 192;
              index_shift = 6;
              pixel ++;
            }
	  }
          break;

        case 4 :
	  for (x = image->width, line_ptr = line, index_shift = 4;
	       x > 0;
	       x --, line_ptr += d) {
	    if (index_shift == 4) i = (*pixel >> 4) & 15;
	    else i = *pixel & 15;

	    line_ptr[0] = cvals[i][0];
	    line_ptr[1] = cvals[i][1];
	    line_ptr[2] = cvals[i][2];

            if (index_shift > 0) {
              index_shift = 0;
	    } else {
              index_shift = 4;
              pixel ++;
            }
	  }
          break;

        case 8 :
	  for (x = image->width, line_ptr = line;
	       x > 0;
	       x --, line_ptr += d, pixel ++) {
	    line_ptr[0] = cvals[*pixel][0];
	    line_ptr[1] = cvals[*pixel][1];
	    line_ptr[2] = cvals[*pixel][2];
	  }
          break;

        case 12 :
	  for (x = image->width, line_ptr = line, index_shift = 0;
	       x > 0;
	       x --, line_ptr += d) {
	    if (index_shift == 0) {
	      i = ((pixel[0] << 4) | (pixel[1] >> 4)) & 4095;
	    } else {
	      i = ((pixel[1] << 8) | pixel[2]) & 4095;
	    }

	    line_ptr[0] = cvals[i][0];
	    line_ptr[1] = cvals[i][1];
	    line_ptr[2] = cvals[i][2];

            if (index_shift == 0) {
              index_shift = 4;
            } else {
              index_shift = 0;
              pixel += 3;
            }
	  }
          break;
      }
    }
  } else {
    // RGB(A) image, so figure out the shifts & masks...
    red_mask  = image->red_mask;
    red_shift = 0;

    while ((red_mask & 1) == 0) {
      red_mask >>= 1;
      red_shift ++;
    }

    green_mask  = image->green_mask;
    green_shift = 0;

    while ((green_mask & 1) == 0) {
      green_mask >>= 1;
      green_shift ++;
    }

    blue_mask  = image->blue_mask;
    blue_shift = 0;

    while ((blue_mask & 1) == 0) {
      blue_mask >>= 1;
      blue_shift ++;
    }

    // Read the pixels and output an RGB image...
    for (y = 0; y < image->height; y ++) {
      pixel = (unsigned char *)(image->data + y * image->bytes_per_line);
      line  = p + y * w * d;

      switch (image->bits_per_pixel) {
        case 8 :
	  for (x = image->width, line_ptr = line;
	       x > 0;
	       x --, line_ptr += d, pixel ++) {
	    i = *pixel;

	    line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	    line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	    line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	  }
          break;

        case 12 :
	  for (x = image->width, line_ptr = line, index_shift = 0;
	       x > 0;
	       x --, line_ptr += d) {
	    if (index_shift == 0) {
	      i = ((pixel[0] << 4) | (pixel[1] >> 4)) & 4095;
	    } else {
	      i = ((pixel[1] << 8) | pixel[2]) & 4095;
            }

	    line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	    line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	    line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;

            if (index_shift == 0) {
              index_shift = 4;
            } else {
              index_shift = 0;
              pixel += 3;
            }
	  }
          break;

        case 16 :
          if (image->byte_order == LSBFirst) {
            // Little-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 2) {
	      i = (pixel[1] << 8) | pixel[0];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  } else {
            // Big-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 2) {
	      i = (pixel[0] << 8) | pixel[1];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  }
          break;

        case 24 :
          if (image->byte_order == LSBFirst) {
            // Little-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 3) {
	      i = (((pixel[2] << 8) | pixel[1]) << 8) | pixel[0];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  } else {
            // Big-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 3) {
	      i = (((pixel[0] << 8) | pixel[1]) << 8) | pixel[2];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  }
          break;

        case 32 :
          if (image->byte_order == LSBFirst) {
            // Little-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 4) {
	      i = (((((pixel[3] << 8) | pixel[2]) << 8) | pixel[1]) << 8) | pixel[0];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  } else {
            // Big-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 4) {
	      i = (((((pixel[0] << 8) | pixel[1]) << 8) | pixel[2]) << 8) | pixel[3];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  }
          break;
      }
    }
  }

  // Destroy the X image we've read and return the RGB(A) image...
  XDestroyImage(image);

  return p;
}